

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QAV.h
# Opt level: O0

void __thiscall
QAV<MonahanPOMDPPlanner>::QAV
          (QAV<MonahanPOMDPPlanner> *this,PlanningUnitDecPOMDPDiscrete *pu,
          MonahanPOMDPPlanner *POMDPPlanner)

{
  PlanningUnit *this_00;
  size_t sVar1;
  PlanningUnitDecPOMDPDiscrete *this_01;
  size_t sVar2;
  undefined8 uVar3;
  QFunctionForDecPOMDPInterface in_RDX;
  QFunctionForDecPOMDPInterface *in_RDI;
  AlphaVectorPlanning *in_stack_ffffffffffffffa8;
  PlanningUnitDecPOMDPDiscrete *in_stack_ffffffffffffffb0;
  void **in_stack_ffffffffffffffb8;
  QFunctionForDecPOMDP *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffd8;
  E *in_stack_ffffffffffffffe0;
  
  QFunctionInterface::QFunctionInterface((QFunctionInterface *)in_RDI);
  QFunctionForDecPOMDPInterface::QFunctionForDecPOMDPInterface(in_RDI,&PTR_PTR_00d0a6f0);
  QFunctionForDecPOMDP::QFunctionForDecPOMDP
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  QFunctionJAOHInterface::QFunctionJAOHInterface
            ((QFunctionJAOHInterface *)(in_RDI + 6),&PTR_construction_vtable_136__00d0a728);
  QFunctionJointBelief::QFunctionJointBelief
            ((QFunctionJointBelief *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0);
  *in_RDI = (QFunctionForDecPOMDPInterface)0xd0a430;
  *in_RDI = (QFunctionForDecPOMDPInterface)0xd0a430;
  *in_RDI = (QFunctionForDecPOMDPInterface)0xd0a430;
  in_RDI[2] = (QFunctionForDecPOMDPInterface)0xd0a530;
  in_RDI[6] = (QFunctionForDecPOMDPInterface)0xd0a620;
  in_RDI[1] = in_RDX;
  this_00 = (PlanningUnit *)
            (**(code **)(*(long *)(&in_RDI->field_0x0 + *(long *)((long)*in_RDI + -0x88)) + 0x60))
                      (&in_RDI->field_0x0 + *(long *)((long)*in_RDI + -0x88));
  sVar1 = PlanningUnit::GetHorizon(this_00);
  this_01 = AlphaVectorPlanning::GetPU(in_stack_ffffffffffffffa8);
  sVar2 = PlanningUnit::GetHorizon((PlanningUnit *)this_01);
  if (sVar1 != sVar2) {
    uVar3 = __cxa_allocate_exception(0x28);
    E::E(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    __cxa_throw(uVar3,&E::typeinfo,E::~E);
  }
  return;
}

Assistant:

QAV(const PlanningUnitDecPOMDPDiscrete* pu, P* POMDPPlanner) :
        QFunctionForDecPOMDP(pu), //virtual base first
        QFunctionJointBelief(pu)
        {
            _m_p=POMDPPlanner;
            if(GetPU()->GetHorizon()!=POMDPPlanner->GetPU()->GetHorizon())
                throw(E("QAV ctor: horizons must match"));
        }